

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CoverpointSymbol::serializeTo(CoverpointSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  Expression *__n;
  ASTSerializer *in_RSI;
  ASTSerializer *in_RDI;
  CoverpointSymbol *in_stack_00000010;
  Expression *iff;
  CoverageOptionSetter *opt;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *__range3;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *in_stack_ffffffffffffff88;
  __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff90;
  ASTSerializer *in_stack_ffffffffffffff98;
  int __fd;
  ASTSerializer *in_stack_ffffffffffffffa8;
  CoverageOptionSetter *in_stack_ffffffffffffffb0;
  __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
  local_30;
  group_type_pointer *local_28;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)
                     0x43c484);
  if (!bVar1) {
    in_stack_ffffffffffffff98 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)local_10);
    name._M_str = (char *)in_stack_ffffffffffffffb0;
    name._M_len = (size_t)in_stack_ffffffffffffffa8;
    ASTSerializer::startArray(in_RDI,name);
    local_28 = &in_RDI[2].visiting.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                .arrays.groups_;
    local_30._M_current =
         (CoverageOptionSetter *)
         std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::begin
                   (in_stack_ffffffffffffff88);
    std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::end
              ((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)
               in_stack_ffffffffffffff98);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                        (in_stack_ffffffffffffff90,
                         (__normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffff88);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
      ::operator*(&local_30);
      ASTSerializer::startObject((ASTSerializer *)0x43c519);
      CoverageOptionSetter::serializeTo(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      ASTSerializer::endObject((ASTSerializer *)0x43c532);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
      ::operator++(&local_30);
    }
    ASTSerializer::endArray((ASTSerializer *)0x43c548);
  }
  __fd = (int)in_stack_ffffffffffffffa8;
  __n = getIffExpr(in_stack_00000010);
  if (__n != (Expression *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
               (char *)in_stack_ffffffffffffff98);
    ASTSerializer::write(local_10,__fd,in_stack_ffffffffffffffb0,(size_t)__n);
  }
  return;
}

Assistant:

void CoverpointSymbol::serializeTo(ASTSerializer& serializer) const {
    if (!options.empty()) {
        serializer.startArray("options");
        for (auto& opt : options) {
            serializer.startObject();
            opt.serializeTo(serializer);
            serializer.endObject();
        }
        serializer.endArray();
    }

    if (auto iff = getIffExpr())
        serializer.write("iff", *iff);
}